

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O3

void __thiscall
vkt::shaderexecutor::anon_unknown_0::LdexpCaseInstance::getInputValues
          (LdexpCaseInstance *this,int numValues,void **values)

{
  float fVar1;
  float fVar2;
  pointer pSVar3;
  void *pvVar4;
  void *pvVar5;
  deUint32 dVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  deBool dVar10;
  deUint32 dVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  deUint32 u32;
  float fVar22;
  Random rnd;
  deRandom local_58;
  float local_48 [6];
  
  local_48[0] = -2.0;
  local_48[1] = 2.0;
  local_48[2] = -1000.0;
  local_48[3] = 1000.0;
  local_48[4] = -1e+07;
  local_48[5] = 1e+07;
  dVar6 = deStringHash((this->super_CommonFunctionTestInstance).m_name);
  deRandom_init(&local_58,dVar6 ^ 0x2790a);
  pSVar3 = (this->super_CommonFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar20 = *(uint *)((long)&(pSVar3->varType).m_data + 4);
  uVar7 = glu::getDataTypeScalarSize((pSVar3->varType).m_data.basic.type);
  uVar13 = (ulong)uVar7;
  iVar8 = 0;
  uVar15 = 0;
  do {
    uVar12 = (&DAT_00b2cb60)[uVar15];
    if (uVar15 < 2) {
      uVar16 = uVar12 & 0x80000000;
      iVar9 = 0;
    }
    else {
      uVar16 = uVar12 & 0x807fffff | 0x3f000000;
      iVar18 = (uVar12 >> 0x17 & 0xff) - 0x7e;
      iVar9 = iVar18;
      if ((uVar12 & 0x7fffff) != 0) {
        iVar9 = -0x7d;
      }
      if ((uVar12 & 0x7f800000) != 0) {
        iVar9 = iVar18;
      }
    }
    if (0 < (int)uVar7) {
      pvVar4 = *values;
      pvVar5 = values[1];
      uVar17 = uVar13;
      iVar18 = iVar8;
      do {
        *(uint *)((long)pvVar4 + (long)iVar18 * 4) = uVar16;
        *(int *)((long)pvVar5 + (long)iVar18 * 4) = iVar9;
        iVar18 = iVar18 + 1;
        uVar17 = uVar17 - 1;
      } while (uVar17 != 0);
    }
    uVar15 = uVar15 + 1;
    iVar8 = iVar8 + uVar7;
  } while (uVar15 != 8);
  iVar9 = numValues + -8;
  iVar8 = 0x32;
  if (uVar20 != 2) {
    iVar8 = iVar9;
  }
  if (iVar8 < 1) {
    iVar8 = 8;
  }
  else {
    iVar8 = iVar8 + 8;
    iVar18 = uVar7 * 8;
    iVar9 = 8;
    do {
      if (0 < (int)uVar7) {
        fVar1 = local_48[(ulong)uVar20 * 2];
        fVar2 = local_48[(ulong)uVar20 * 2 + 1];
        uVar15 = uVar13;
        iVar19 = iVar18;
        do {
          fVar22 = deRandom_getFloat(&local_58);
          fVar22 = fVar22 * (fVar2 - fVar1) + fVar1;
          if ((fVar22 != 0.0) || (NAN(fVar22))) {
            uVar12 = (uint)fVar22 & 0x807fffff | 0x3f000000;
            iVar14 = ((uint)fVar22 >> 0x17 & 0xff) - 0x7e;
            iVar21 = iVar14;
            if (((uint)fVar22 & 0x7fffff) != 0) {
              iVar21 = -0x7d;
            }
            if (((uint)fVar22 & 0x7f800000) != 0) {
              iVar21 = iVar14;
            }
          }
          else {
            uVar12 = (uint)fVar22 & 0x80000000;
            iVar21 = 0;
          }
          *(uint *)((long)*values + (long)iVar19 * 4) = uVar12;
          *(int *)((long)values[1] + (long)iVar19 * 4) = iVar21;
          iVar19 = iVar19 + 1;
          uVar15 = uVar15 - 1;
        } while (uVar15 != 0);
      }
      iVar9 = iVar9 + 1;
      iVar18 = iVar18 + uVar7;
    } while (iVar9 != iVar8);
    iVar9 = numValues - iVar8;
  }
  if (0 < iVar9) {
    iVar9 = uVar7 * iVar8;
    do {
      uVar15 = uVar13;
      iVar18 = iVar9;
      if (0 < (int)uVar7) {
        do {
          dVar6 = deRandom_getUint32(&local_58);
          uVar20 = dVar6 >> 1;
          iVar21 = uVar20 / 0x7f + uVar20 / 0x7f + (uVar20 / 0x7f) * -0x100 + dVar6;
          dVar10 = deRandom_getBool(&local_58);
          dVar6 = deRandom_getUint32(&local_58);
          iVar19 = -iVar21;
          if (-iVar21 < -0x7d) {
            iVar19 = -0x7e;
          }
          uVar20 = 0xfdU - iVar21;
          if (0x7e < 0xfdU - iVar21) {
            uVar20 = 0x7f;
          }
          dVar11 = deRandom_getUint32(&local_58);
          *(uint *)((long)*values + (long)iVar18 * 4) =
               iVar21 * 0x800000 + ((uint)(dVar10 == 1) << 0x1f | dVar6 & 0x7fffff) + 0x800000;
          *(uint *)((long)values[1] + (long)iVar18 * 4) = dVar11 % ((uVar20 - iVar19) + 1) + iVar19;
          iVar18 = iVar18 + 1;
          uVar15 = uVar15 - 1;
        } while (uVar15 != 0);
      }
      iVar8 = iVar8 + 1;
      iVar9 = iVar9 + uVar7;
    } while (iVar8 != numValues);
  }
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		const Vec2 ranges[] =
		{
			Vec2(-2.0f,		2.0f),	// lowp
			Vec2(-1e3f,		1e3f),	// mediump
			Vec2(-1e7f,		1e7f)	// highp
		};

		de::Random				rnd					(deStringHash(m_name) ^ 0x2790au);
		const glu::DataType		type				= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision			= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize			= glu::getDataTypeScalarSize(type);
		int						valueNdx			= 0;

		{
			const float easySpecialCases[] = { 0.0f, -0.0f, 0.5f, -0.5f, 1.0f, -1.0f, 2.0f, -2.0f };

			DE_ASSERT(valueNdx + DE_LENGTH_OF_ARRAY(easySpecialCases) <= numValues);
			for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(easySpecialCases); caseNdx++)
			{
				float	in0;
				int		in1;

				frexp(easySpecialCases[caseNdx], &in0, &in1);

				for (int compNdx = 0; compNdx < scalarSize; compNdx++)
				{
					((float*)values[0])[valueNdx*scalarSize + compNdx] = in0;
					((int*)values[1])[valueNdx*scalarSize + compNdx] = in1;
				}

				valueNdx += 1;
			}
		}

		{
			// \note lowp and mediump can not necessarily fit the values in hard cases, so we'll use only easy ones.
			const int numEasyRandomCases = precision == glu::PRECISION_HIGHP ? 50 : (numValues-valueNdx);

			DE_ASSERT(valueNdx + numEasyRandomCases <= numValues);
			for (int caseNdx = 0; caseNdx < numEasyRandomCases; caseNdx++)
			{
				for (int compNdx = 0; compNdx < scalarSize; compNdx++)
				{
					const float	in	= rnd.getFloat(ranges[precision].x(), ranges[precision].y());
					float		in0;
					int			in1;

					frexp(in, &in0, &in1);

					((float*)values[0])[valueNdx*scalarSize + compNdx] = in0;
					((int*)values[1])[valueNdx*scalarSize + compNdx] = in1;
				}

				valueNdx += 1;
			}
		}

		{
			const int numHardRandomCases = numValues-valueNdx;
			DE_ASSERT(numHardRandomCases >= 0 && valueNdx + numHardRandomCases <= numValues);

			for (int caseNdx = 0; caseNdx < numHardRandomCases; caseNdx++)
			{
				for (int compNdx = 0; compNdx < scalarSize; compNdx++)
				{
					const int		fpExp		= rnd.getInt(-126, 127);
					const int		sign		= rnd.getBool() ? -1 : +1;
					const deUint32	mantissa	= (1u<<23) | (rnd.getUint32() & ((1u<<23)-1));
					const int		in1			= rnd.getInt(de::max(-126, -126-fpExp), de::min(127, 127-fpExp));
					const float		in0			= tcu::Float32::construct(sign, fpExp, mantissa).asFloat();

					DE_ASSERT(de::inRange(in1, -126, 127)); // See Khronos bug 11180
					DE_ASSERT(de::inRange(in1+fpExp, -126, 127));

					const float		out			= ldexp(in0, in1);

					DE_ASSERT(!tcu::Float32(out).isInf() && !tcu::Float32(out).isDenorm());
					DE_UNREF(out);

					((float*)values[0])[valueNdx*scalarSize + compNdx] = in0;
					((int*)values[1])[valueNdx*scalarSize + compNdx] = in1;
				}

				valueNdx += 1;
			}
		}
	}